

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

int rnl(int x)

{
  uint uVar1;
  int iVar2;
  int local_14;
  int local_10;
  int i;
  int x_local;
  
  uVar1 = mt_random();
  local_10 = (int)((long)(ulong)uVar1 % (long)x);
  if (((int)u.uluck + (int)u.moreluck != 0) &&
     (iVar2 = rn2(0x32 - ((int)u.uluck + (int)u.moreluck)), iVar2 != 0)) {
    if ((x < 0x10) && (-6 < (int)u.uluck + (int)u.moreluck)) {
      local_14 = ((int)u.uluck + (int)u.moreluck) / 3;
    }
    else {
      local_14 = (int)u.uluck + (int)u.moreluck;
    }
    local_10 = local_10 - local_14;
    if (local_10 < 0) {
      local_10 = 0;
    }
    else if (x <= local_10) {
      local_10 = x + -1;
    }
  }
  return local_10;
}

Assistant:

static inline int rnl(int x)
{
	int i;

	i = RND(x);

	if (Luck && rn2(50 - Luck)) {
	    i -= (x <= 15 && Luck >= -5 ? Luck/3 : Luck);
	    if (i < 0) i = 0;
	    else if (i >= x) i = x-1;
	}

	return i;
}